

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O0

bool __thiscall
ASDCP::MXF::
FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
::Archive(FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
          *this,MemIOWriter *Writer)

{
  const_iterator this_00;
  bool bVar1;
  ui32_t i_00;
  int iVar2;
  size_type sVar3;
  pointer pDVar4;
  byte local_59;
  __normal_iterator<const_ASDCP::MXF::IndexTableSegment::DeltaEntry_*,_std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
  local_40;
  DeltaEntry *local_38;
  byte local_29;
  const_iterator cStack_28;
  bool result;
  const_iterator i;
  MemIOWriter *Writer_local;
  FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
  *this_local;
  
  i._M_current = (DeltaEntry *)Writer;
  sVar3 = std::
          vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
          ::size(&this->
                  super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                );
  bVar1 = Kumu::MemIOWriter::WriteUi32BE(Writer,(ui32_t)sVar3);
  this_00 = i;
  if (bVar1) {
    i_00 = ItemSize(this);
    bVar1 = Kumu::MemIOWriter::WriteUi32BE((MemIOWriter *)this_00._M_current,i_00);
    if (bVar1) {
      bVar1 = std::
              vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
              ::empty(&this->
                       super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                     );
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        __gnu_cxx::
        __normal_iterator<const_ASDCP::MXF::IndexTableSegment::DeltaEntry_*,_std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
        ::__normal_iterator(&stack0xffffffffffffffd8);
        local_29 = 1;
        local_38 = (DeltaEntry *)
                   std::
                   vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                   ::begin(&this->
                            super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                          );
        cStack_28 = (const_iterator)local_38;
        while( true ) {
          local_40._M_current =
               (DeltaEntry *)
               std::
               vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
               ::end(&this->
                      super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                    );
          bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffffd8,&local_40);
          local_59 = 0;
          if (bVar1) {
            local_59 = local_29;
          }
          if ((local_59 & 1) == 0) break;
          pDVar4 = __gnu_cxx::
                   __normal_iterator<const_ASDCP::MXF::IndexTableSegment::DeltaEntry_*,_std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
                   ::operator->(&stack0xffffffffffffffd8);
          iVar2 = (*(pDVar4->super_IArchive)._vptr_IArchive[4])(pDVar4,i._M_current);
          local_29 = (byte)iVar2 & 1;
          __gnu_cxx::
          __normal_iterator<const_ASDCP::MXF::IndexTableSegment::DeltaEntry_*,_std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
          ::operator++(&stack0xffffffffffffffd8);
        }
        this_local._7_1_ = (bool)(local_29 & 1);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Archive(Kumu::MemIOWriter* Writer) const {
	    if ( ! Writer->WriteUi32BE((ui32_t)this->size()) ) return false;
	    if ( ! Writer->WriteUi32BE((ui32_t)this->ItemSize()) ) return false;
	    if ( this->empty() ) return true;
	    
	    typename ContainerType::const_iterator i;
	    bool result = true;
	    for ( i = this->begin(); i != this->end() && result; ++i )
	      {
		result = i->Archive(Writer);
	      }

	    return result;
	  }